

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

Template * __thiscall
inja::Parser::parse(Template *__return_storage_ptr__,Parser *this,string_view input,path *path)

{
  allocator<char> local_59;
  string local_58;
  undefined1 local_31;
  path *local_30;
  path *path_local;
  Parser *this_local;
  string_view input_local;
  Template *result;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (Parser *)input._M_len;
  local_31 = 0;
  local_30 = path;
  path_local = (path *)this;
  input_local._M_str = (char *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_59);
  Template::Template(__return_storage_ptr__,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  parse_into(this,__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

Template parse(std::string_view input, std::filesystem::path path) {
    auto result = Template(std::string(input));
    parse_into(result, path);
    return result;
  }